

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LameWrapper.cpp
# Opt level: O3

void __thiscall cinemo::LameWrapper::LameWrapper(LameWrapper *this,string *dir,string *file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  size_type *psVar5;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (this->dir)._M_dataplus._M_p = (pointer)&(this->dir).field_2;
  pcVar2 = (dir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + dir->_M_string_length);
  (this->file)._M_dataplus._M_p = (pointer)&(this->file).field_2;
  pcVar2 = (file->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->file,pcVar2,pcVar2 + file->_M_string_length);
  pcVar2 = (dir->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + dir->_M_string_length);
  std::__cxx11::string::append((char *)local_50);
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_50,(ulong)(file->_M_dataplus)._M_p)
  ;
  paVar1 = &(this->path).field_2;
  (this->path)._M_dataplus._M_p = (pointer)paVar1;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar3 = plVar4[3];
    paVar1->_M_allocated_capacity = *psVar5;
    *(long *)((long)&(this->path).field_2 + 8) = lVar3;
  }
  else {
    (this->path)._M_dataplus._M_p = (pointer)*plVar4;
    (this->path).field_2._M_allocated_capacity = *psVar5;
  }
  (this->path)._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  (this->wh)._M_t.
  super___uniq_ptr_impl<cinemo::wh::WaveHeader,_std::default_delete<cinemo::wh::WaveHeader>_>._M_t.
  super__Tuple_impl<0UL,_cinemo::wh::WaveHeader_*,_std::default_delete<cinemo::wh::WaveHeader>_>.
  super__Head_base<0UL,_cinemo::wh::WaveHeader_*,_false>._M_head_impl = (WaveHeader *)0x0;
  (this->message_buffer)._M_dataplus._M_p = (pointer)&(this->message_buffer).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->message_buffer,"");
  this->initDone = false;
  this->isBusy = false;
  this->isDone = false;
  this->quality = 3;
  return;
}

Assistant:

LameWrapper::LameWrapper(const string& dir, const string& file)
            : dir(dir), file(file), path(dir + "/" + file),
              wh(), message_buffer(""), initDone(false),
              isBusy(false), isDone(false) {
    }